

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O3

bool __thiscall
google::protobuf::util::MessageDifferencer::MapEntryKeyComparator::IsMatch
          (MapEntryKeyComparator *this,Message *message1,Message *message2,int unpacked_any,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  bool bVar1;
  FieldDescriptor *field;
  MessageDifferencer *this_00;
  Metadata MVar2;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  current_parent_fields;
  
  MVar2 = Message::GetMetadata(message1);
  field = Descriptor::FindFieldByNumber(MVar2.descriptor,1);
  this_00 = this->message_differencer_;
  if (this_00->scope_ == PARTIAL) {
    MVar2 = Message::GetMetadata(message1);
    bVar1 = Reflection::HasField(MVar2.reflection,message1,field);
    if (bVar1) {
      this_00 = this->message_differencer_;
      goto LAB_00fc6150;
    }
    std::
    vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
    ::vector(&current_parent_fields,parent_fields);
  }
  else {
LAB_00fc6150:
    bVar1 = IsIgnored(this_00,message1,message2,field,parent_fields);
    std::
    vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
    ::vector(&current_parent_fields,parent_fields);
    if (!bVar1) {
      bVar1 = CompareFieldValueUsingParentFields
                        (this->message_differencer_,message1,message2,unpacked_any,field,-1,-1,
                         &current_parent_fields);
      goto LAB_00fc61c5;
    }
  }
  bVar1 = Compare(this->message_differencer_,message1,message2,unpacked_any,&current_parent_fields);
LAB_00fc61c5:
  if (current_parent_fields.
      super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(current_parent_fields.
                    super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)current_parent_fields.
                          super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)current_parent_fields.
                          super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool MessageDifferencer::MapEntryKeyComparator::IsMatch(
    const Message& message1, const Message& message2, int unpacked_any,
    const std::vector<SpecificField>& parent_fields) const {
  // Map entry has its key in the field with tag 1.  See the comment for
  // map_entry in MessageOptions.
  const FieldDescriptor* key = message1.GetDescriptor()->FindFieldByNumber(1);
  // If key is not present in message1 and we're doing partial comparison or if
  // map key is explicitly ignored treat the field as set instead,
  const bool treat_as_set =
      (message_differencer_->scope() == PARTIAL &&
       !message1.GetReflection()->HasField(message1, key)) ||
      message_differencer_->IsIgnored(message1, message2, key, parent_fields);

  std::vector<SpecificField> current_parent_fields(parent_fields);
  if (treat_as_set) {
    return message_differencer_->Compare(message1, message2, unpacked_any,
                                         &current_parent_fields);
  }
  return message_differencer_->CompareFieldValueUsingParentFields(
      message1, message2, unpacked_any, key, -1, -1, &current_parent_fields);
}